

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas2.c
# Opt level: O1

int sp_zgemv(char *trans,doublecomplex alpha,SuperMatrix *A,doublecomplex *x,int incx,
            doublecomplex beta,doublecomplex *y,int incy)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  int iVar4;
  int_t *piVar5;
  doublecomplex *pdVar6;
  ulong uVar7;
  undefined8 uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  double *pdVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int info;
  char msg [256];
  int local_184;
  ulong local_180;
  int local_174;
  uint local_170;
  int local_16c;
  long local_168;
  void *local_160;
  double local_158;
  double local_148;
  char local_138 [264];
  
  dVar21 = beta.i;
  dVar20 = beta.r;
  dVar19 = alpha.i;
  dVar18 = alpha.r;
  bVar3 = *trans;
  pvVar14 = A->Store;
  lVar15 = *(long *)((long)pvVar14 + 8);
  local_184 = 0;
  if ((bVar3 - 0x43 < 0x2c) && ((0x80000020801U >> ((ulong)(bVar3 - 0x43) & 0x3f) & 1) != 0)) {
    if ((A->nrow < 0) || (A->ncol < 0)) {
      local_184 = 3;
    }
    else if (incx == 0) {
      local_184 = 5;
    }
    else if (incy == 0) {
      local_184 = 8;
    }
  }
  else {
    local_184 = 1;
  }
  if (local_184 == 0) {
    if (((A->nrow != 0) && (local_180 = (ulong)(uint)A->ncol, local_180 != 0)) &&
       ((uVar17 = -(uint)(dVar18 == 0.0 && dVar19 == 0.0), (uVar17 & 1) == 0 ||
        ((((dVar20 != 1.0 || (NAN(dVar20))) || (dVar21 != 0.0)) || (NAN(dVar21))))))) {
      piVar5 = &A->ncol;
      if ((bVar3 & 0xdf) == 0x4e) {
        piVar5 = &A->nrow;
      }
      uVar9 = *piVar5;
      uVar7 = (ulong)uVar9;
      if (incx < 1) {
        piVar5 = &A->nrow;
        if ((bVar3 & 0xdf) == 0x4e) {
          piVar5 = &A->ncol;
        }
        lVar16 = (long)incx * (1 - (long)*piVar5);
      }
      else {
        lVar16 = 0;
      }
      iVar11 = (1 - uVar9) * incy;
      if (0 < incy) {
        iVar11 = 0;
      }
      if (((dVar20 != 1.0) || (NAN(dVar20))) || ((dVar21 != 0.0 || (NAN(dVar21))))) {
        if (incy == 1) {
          if (dVar20 != 0.0 || dVar21 != 0.0) {
            if (0 < (int)uVar9) {
              lVar10 = 0;
              do {
                dVar1 = *(double *)((long)&y->r + lVar10);
                dVar2 = *(double *)((long)&y->i + lVar10);
                *(double *)((long)&y->r + lVar10) = dVar20 * dVar1 - dVar2 * dVar21;
                *(double *)((long)&y->i + lVar10) = dVar1 * dVar21 + dVar2 * dVar20;
                lVar10 = lVar10 + 0x10;
              } while (uVar7 << 4 != lVar10);
            }
          }
          else if (0 < (int)uVar9) {
            local_174 = iVar11;
            local_170 = uVar17;
            local_16c = incy;
            local_168 = lVar15;
            local_160 = pvVar14;
            local_158 = dVar18;
            local_148 = dVar19;
            memset(y,0,uVar7 << 4);
            pvVar14 = local_160;
            lVar15 = local_168;
            dVar19 = local_148;
            dVar18 = local_158;
            iVar11 = local_174;
            incy = local_16c;
            uVar17 = local_170;
          }
        }
        else if (dVar20 != 0.0 || dVar21 != 0.0) {
          if (0 < (int)uVar9) {
            pdVar13 = &y[iVar11].i;
            do {
              dVar1 = ((doublecomplex *)(pdVar13 + -1))->r;
              dVar2 = *pdVar13;
              ((doublecomplex *)(pdVar13 + -1))->r = dVar20 * dVar1 - dVar2 * dVar21;
              *pdVar13 = dVar1 * dVar21 + dVar2 * dVar20;
              pdVar13 = pdVar13 + (long)incy * 2;
              uVar9 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar9;
            } while (uVar9 != 0);
          }
        }
        else if (0 < (int)uVar9) {
          pdVar6 = y + iVar11;
          do {
            pdVar6->r = 0.0;
            pdVar6->i = 0.0;
            pdVar6 = pdVar6 + incy;
            uVar9 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar9;
          } while (uVar9 != 0);
        }
      }
      if ((uVar17 & 1) == 0) {
        if ((bVar3 | 0x20) == 0x6e) {
          if (incy == 1) {
            if ((int)local_180 < 1) {
              return 0;
            }
            uVar7 = 0;
            do {
              dVar20 = x[lVar16].r;
              if (((dVar20 != 0.0) || (NAN(dVar20))) || ((x[lVar16].i != 0.0 || (NAN(x[lVar16].i))))
                 ) {
                iVar11 = *(int *)(*(long *)((long)pvVar14 + 0x18) + uVar7 * 4);
                lVar10 = (long)iVar11;
                iVar4 = *(int *)(*(long *)((long)pvVar14 + 0x18) + 4 + uVar7 * 4);
                if (iVar11 < iVar4) {
                  dVar21 = dVar18 * dVar20 - x[lVar16].i * dVar19;
                  dVar20 = dVar20 * dVar19 + x[lVar16].i * dVar18;
                  lVar12 = *(long *)((long)pvVar14 + 0x10);
                  pdVar13 = (double *)(lVar10 * 0x10 + lVar15 + 8);
                  do {
                    iVar11 = *(int *)(lVar12 + lVar10 * 4);
                    dVar1 = pdVar13[-1];
                    dVar2 = *pdVar13;
                    y[iVar11].r = dVar21 * dVar1 + dVar2 * -dVar20 + y[iVar11].r;
                    y[iVar11].i = dVar1 * dVar20 + dVar2 * dVar21 + y[iVar11].i;
                    lVar10 = lVar10 + 1;
                    pdVar13 = pdVar13 + 2;
                  } while (iVar4 != lVar10);
                }
              }
              lVar16 = lVar16 + incx;
              uVar7 = uVar7 + 1;
            } while (uVar7 != local_180);
            return 0;
          }
          uVar8 = 0x22b;
        }
        else if ((byte)(*trans | 0x20U) == 0x74) {
          if (incx == 1) {
            if ((int)local_180 < 1) {
              return 0;
            }
            lVar16 = *(long *)((long)pvVar14 + 0x18);
            lVar10 = (long)iVar11;
            uVar7 = 0;
            do {
              iVar11 = *(int *)(lVar16 + uVar7 * 4);
              lVar12 = (long)iVar11;
              iVar4 = *(int *)(lVar16 + 4 + uVar7 * 4);
              dVar20 = 0.0;
              dVar21 = 0.0;
              if (iVar11 < iVar4) {
                pdVar13 = (double *)(lVar12 * 0x10 + lVar15 + 8);
                do {
                  iVar11 = *(int *)(*(long *)((long)pvVar14 + 0x10) + lVar12 * 4);
                  dVar20 = dVar20 + (pdVar13[-1] * x[iVar11].r - x[iVar11].i * *pdVar13);
                  dVar21 = dVar21 + *pdVar13 * x[iVar11].r + pdVar13[-1] * x[iVar11].i;
                  lVar12 = lVar12 + 1;
                  pdVar13 = pdVar13 + 2;
                } while (iVar4 != lVar12);
              }
              y[lVar10].r = (dVar18 * dVar20 - dVar21 * dVar19) + y[lVar10].r;
              uVar7 = uVar7 + 1;
              y[lVar10].i = dVar20 * dVar19 + dVar21 * dVar18 + y[lVar10].i;
              lVar10 = lVar10 + incy;
            } while (uVar7 != local_180);
            return 0;
          }
          uVar8 = 0x23d;
        }
        else {
          if (incx == 1) {
            if ((int)local_180 < 1) {
              return 0;
            }
            lVar16 = *(long *)((long)pvVar14 + 0x18);
            lVar10 = (long)iVar11;
            uVar7 = 0;
            do {
              iVar11 = *(int *)(lVar16 + uVar7 * 4);
              lVar12 = (long)iVar11;
              iVar4 = *(int *)(lVar16 + 4 + uVar7 * 4);
              dVar20 = 0.0;
              dVar21 = 0.0;
              if (iVar11 < iVar4) {
                pdVar13 = (double *)(lVar12 * 0x10 + lVar15 + 8);
                do {
                  iVar11 = *(int *)(*(long *)((long)pvVar14 + 0x10) + lVar12 * 4);
                  dVar20 = dVar20 + pdVar13[-1] * x[iVar11].r + *pdVar13 * x[iVar11].i;
                  dVar21 = dVar21 + (pdVar13[-1] * x[iVar11].i - *pdVar13 * x[iVar11].r);
                  lVar12 = lVar12 + 1;
                  pdVar13 = pdVar13 + 2;
                } while (iVar4 != lVar12);
              }
              y[lVar10].r = (dVar18 * dVar20 - dVar21 * dVar19) + y[lVar10].r;
              uVar7 = uVar7 + 1;
              y[lVar10].i = dVar20 * dVar19 + dVar21 * dVar18 + y[lVar10].i;
              lVar10 = lVar10 + incy;
            } while (uVar7 != local_180);
            return 0;
          }
          uVar8 = 0x252;
        }
        sprintf(local_138,"%s at line %d in file %s\n","Not implemented.",uVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c"
               );
        superlu_abort_and_exit(local_138);
      }
    }
  }
  else {
    input_error("sp_zgemv ",&local_184);
  }
  return 0;
}

Assistant:

int
sp_zgemv(char *trans, doublecomplex alpha, SuperMatrix *A, doublecomplex *x, 
	 int incx, doublecomplex beta, doublecomplex *y, int incy)
{

    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int info;
    doublecomplex temp, temp1;
    int lenx, leny, i, j, irow;
    int iy, jx, jy, kx, ky;
    int notran;
    doublecomplex comp_zero = {0.0, 0.0};
    doublecomplex comp_one = {1.0, 0.0};

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0)
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_zgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if ( A->nrow == 0 || A->ncol == 0 || 
	 (z_eq(&alpha, &comp_zero) && z_eq(&beta, &comp_one)) )
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if ( notran ) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if ( !z_eq(&beta, &comp_one) ) {
	if (incy == 1) {
	    if ( z_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) y[i] = comp_zero;
	    else
		for (i = 0; i < leny; ++i) 
		  zz_mult(&y[i], &beta, &y[i]);
	} else {
	    iy = ky;
	    if ( z_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) {
		    y[iy] = comp_zero;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    zz_mult(&y[iy], &beta, &y[iy]);
		    iy += incy;
		}
	}
    }
    
    if ( z_eq(&alpha, &comp_zero) ) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if ( !z_eq(&x[jx], &comp_zero) ) {
		    zz_mult(&temp, &alpha, &x[jx]);
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			zz_mult(&temp1, &temp,  &Aval[i]);
			z_add(&y[irow], &y[irow], &temp1);
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else if (strncmp(trans, "T", 1) == 0 || strncmp(trans, "t", 1) == 0) {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    zz_mult(&temp1, &Aval[i], &x[irow]);
		    z_add(&temp, &temp, &temp1);
		}
		zz_mult(&temp1, &alpha, &temp);
		z_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else { /* trans == 'C' or 'c' */
	/* Form  y := alpha * conj(A) * x + y. */
	doublecomplex temp2;
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp2.r = Aval[i].r;
		    temp2.i = -Aval[i].i;  /* conjugation */
		    zz_mult(&temp1, &temp2, &x[irow]);
		    z_add(&temp, &temp, &temp1);
		}
		zz_mult(&temp1, &alpha, &temp);
		z_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;    
}